

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_common.cpp
# Opt level: O0

void adios2::EVPathRemoteCommon::RegisterFormats(Remote_evpath_state *ev_state)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  
  uVar1 = CMregister_format(*in_RDI,OpenFileStructs);
  in_RDI[1] = uVar1;
  uVar1 = CMregister_format(*in_RDI,OpenSimpleFileStructs);
  in_RDI[2] = uVar1;
  uVar1 = CMregister_format(*in_RDI,OpenResponseStructs);
  in_RDI[3] = uVar1;
  uVar1 = CMregister_format(*in_RDI,OpenSimpleResponseStructs);
  in_RDI[4] = uVar1;
  uVar1 = CMregister_format(*in_RDI,GetRequestStructs);
  in_RDI[5] = uVar1;
  uVar1 = CMregister_format(*in_RDI,ReadRequestStructs);
  in_RDI[6] = uVar1;
  uVar1 = CMregister_format(*in_RDI,ReadResponseStructs);
  in_RDI[7] = uVar1;
  uVar1 = CMregister_format(*in_RDI,CloseFileStructs);
  in_RDI[8] = uVar1;
  uVar1 = CMregister_format(*in_RDI,KillServerStructs);
  in_RDI[9] = uVar1;
  uVar1 = CMregister_format(*in_RDI,KillResponseStructs);
  in_RDI[10] = uVar1;
  uVar1 = CMregister_format(*in_RDI,StatusServerStructs);
  in_RDI[0xb] = uVar1;
  uVar1 = CMregister_format(*in_RDI,StatusResponseStructs);
  in_RDI[0xc] = uVar1;
  return;
}

Assistant:

void RegisterFormats(EVPathRemoteCommon::Remote_evpath_state &ev_state)
{
    ev_state.OpenFileFormat = CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenFileStructs);
    ev_state.OpenSimpleFileFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenSimpleFileStructs);
    ev_state.OpenResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenResponseStructs);
    ev_state.OpenSimpleResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenSimpleResponseStructs);
    ev_state.GetRequestFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::GetRequestStructs);
    ev_state.ReadRequestFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::ReadRequestStructs);
    ev_state.ReadResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::ReadResponseStructs);
    ev_state.CloseFileFormat = CMregister_format(ev_state.cm, EVPathRemoteCommon::CloseFileStructs);
    ev_state.KillServerFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::KillServerStructs);
    ev_state.KillResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::KillResponseStructs);
    ev_state.StatusServerFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::StatusServerStructs);
    ev_state.StatusResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::StatusResponseStructs);
}